

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkTransRel(Abc_Ntk_t *pNtk,int fInputs,int fVerbose)

{
  Abc_Aig_t *pMan;
  Abc_Ntk_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *p1;
  int fSynthesis;
  int nLatches;
  int i;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vPairs;
  char Buffer [1000];
  int fVerbose_local;
  int fInputs_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._992_4_ = fVerbose;
  Buffer._996_4_ = fInputs;
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xa8,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar2 != 0) {
    iVar2 = Abc_NtkLatchNum(pNtk);
    pObj = (Abc_Obj_t *)Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    sprintf((char *)&vPairs,"%s_TR",pNtk->pName);
    pAVar5 = (Abc_Obj_t *)Extra_UtilStrsav(pNtk->pName);
    pObj->pNext = pAVar5;
    Abc_NtkCleanCopy(pNtk);
    for (fSynthesis = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), fSynthesis < iVar3;
        fSynthesis = fSynthesis + 1) {
      pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
        pAVar6 = Abc_ObjFanout0(pAVar5);
        pAVar5 = Abc_NtkCreatePi((Abc_Ntk_t *)pObj);
        (pAVar6->field_6).pCopy = pAVar5;
        pAVar5 = (pAVar6->field_6).pCopy;
        pcVar7 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar5,pcVar7,(char *)0x0);
      }
    }
    for (fSynthesis = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), fSynthesis < iVar3;
        fSynthesis = fSynthesis + 1) {
      pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
      iVar3 = Abc_ObjIsLatch(pAVar5);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
        pAVar5 = Abc_ObjFanin0(pAVar5);
        pAVar6 = Abc_NtkCreatePi((Abc_Ntk_t *)pObj);
        pcVar7 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar6,pcVar7,(char *)0x0);
      }
    }
    for (fSynthesis = 0; iVar3 = Abc_NtkPiNum(pNtk), fSynthesis < iVar3; fSynthesis = fSynthesis + 1
        ) {
      pAVar5 = Abc_NtkPi(pNtk,fSynthesis);
      Abc_NtkDupObj((Abc_Ntk_t *)pObj,pAVar5,1);
    }
    Abc_NtkCreatePo((Abc_Ntk_t *)pObj);
    pAVar5 = Abc_AigConst1((Abc_Ntk_t *)pObj);
    pAVar6 = Abc_AigConst1(pNtk);
    (pAVar6->field_6).pCopy = pAVar5;
    for (fSynthesis = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), fSynthesis < iVar3;
        fSynthesis = fSynthesis + 1) {
      pAVar5 = Abc_NtkObj(pNtk,fSynthesis);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar5), iVar3 != 0)) {
        pMan = *(Abc_Aig_t **)&pObj[3].vFanouts;
        pAVar6 = Abc_ObjChild0Copy(pAVar5);
        p1 = Abc_ObjChild1Copy(pAVar5);
        pAVar6 = Abc_AigAnd(pMan,pAVar6,p1);
        (pAVar5->field_6).pCopy = pAVar6;
      }
    }
    iVar3 = Abc_NtkBoxNum(pNtk);
    iVar4 = Abc_NtkLatchNum(pNtk);
    if (iVar3 == iVar4) {
      pNtkNew = (Abc_Ntk_t *)Vec_PtrAlloc(iVar2 << 1);
      for (fSynthesis = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), fSynthesis < iVar3;
          fSynthesis = fSynthesis + 1) {
        pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
        iVar3 = Abc_ObjIsLatch(pAVar5);
        if (iVar3 != 0) {
          pAVar5 = Abc_NtkBox(pNtk,fSynthesis);
          pAVar5 = Abc_ObjFanin0(pAVar5);
          pAVar1 = pNtkNew;
          pAVar5 = Abc_ObjChild0Copy(pAVar5);
          Vec_PtrPush((Vec_Ptr_t *)pAVar1,pAVar5);
          pAVar1 = pNtkNew;
          pAVar5 = Abc_NtkPi((Abc_Ntk_t *)pObj,fSynthesis + iVar2);
          Vec_PtrPush((Vec_Ptr_t *)pAVar1,pAVar5);
        }
      }
      pAVar5 = Abc_AigMiter(*(Abc_Aig_t **)&pObj[3].vFanouts,(Vec_Ptr_t *)pNtkNew,0);
      Vec_PtrFree((Vec_Ptr_t *)pNtkNew);
      pAVar6 = Abc_NtkPo((Abc_Ntk_t *)pObj,0);
      pAVar5 = Abc_ObjNot(pAVar5);
      Abc_ObjAddFanin(pAVar6,pAVar5);
      pAVar5 = Abc_NtkPo((Abc_Ntk_t *)pObj,0);
      Abc_ObjAssignName(pAVar5,"rel",(char *)0x0);
      if (Buffer._996_4_ != 0) {
        iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pObj);
        iVar4 = Abc_NtkPiNum(pNtk);
        if (iVar3 != iVar4 + iVar2 * 2) {
          __assert_fail("Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                        ,0xd5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
        }
        fSynthesis = Abc_NtkPiNum((Abc_Ntk_t *)pObj);
        while (fSynthesis = fSynthesis + -1,
              SBORROW4(fSynthesis,iVar2 * 2) == fSynthesis + iVar2 * -2 < 0) {
          Abc_NtkQuantify((Abc_Ntk_t *)pObj,0,fSynthesis,Buffer._992_4_);
          Abc_NtkCleanData((Abc_Ntk_t *)pObj);
          Abc_AigCleanup(*(Abc_Aig_t **)&pObj[3].vFanouts);
          Abc_NtkSynthesize((Abc_Ntk_t **)&pObj,1);
        }
        Abc_NtkCleanData((Abc_Ntk_t *)pObj);
        Abc_AigCleanup(*(Abc_Aig_t **)&pObj[3].vFanouts);
        fSynthesis = Abc_NtkPiNum((Abc_Ntk_t *)pObj);
        while (fSynthesis = fSynthesis + -1,
              SBORROW4(fSynthesis,iVar2 * 2) == fSynthesis + iVar2 * -2 < 0) {
          pAVar5 = Abc_NtkPi((Abc_Ntk_t *)pObj,fSynthesis);
          iVar3 = Abc_ObjFanoutNum(pAVar5);
          if (iVar3 != 0) {
            __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                          ,0xea,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
          }
          Abc_NtkDeleteObj(pAVar5);
        }
      }
      iVar2 = Abc_NtkCheck((Abc_Ntk_t *)pObj);
      if (iVar2 == 0) {
        printf("Abc_NtkTransRel: The network check has failed.\n");
        Abc_NtkDelete((Abc_Ntk_t *)pObj);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        pNtk_local = (Abc_Ntk_t *)pObj;
      }
      return pNtk_local;
    }
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xc5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  __assert_fail("Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                ,0xa9,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTransRel( Abc_Ntk_t * pNtk, int fInputs, int fVerbose )
{
    char Buffer[1000];
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pMiter;
    int i, nLatches;
    int fSynthesis = 1;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) );
    nLatches = Abc_NtkLatchNum(pNtk);
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    sprintf( Buffer, "%s_TR", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_NtkCleanCopy( pNtk );
    // create current state variables
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create next state variables
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), Abc_ObjName(pObj), NULL );
    // create PI variables
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create the PO
    Abc_NtkCreatePo( pNtkNew );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create the function of the primary output
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    vPairs = Vec_PtrAlloc( 2*nLatches );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPairs, Abc_NtkPi(pNtkNew, i+nLatches) );
    }
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkNew->pManFunc, vPairs, 0 );
    Vec_PtrFree( vPairs );
    // add the primary output
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), Abc_ObjNot(pMiter) );
    Abc_ObjAssignName( Abc_NtkPo(pNtkNew,0), "rel", NULL );

    // quantify inputs
    if ( fInputs )
    {
        assert( Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
//        for ( i = 2*nLatches; i < Abc_NtkPiNum(pNtkNew); i++ )
        {
            Abc_NtkQuantify( pNtkNew, 0, i, fVerbose );
//            if ( fSynthesis && (i % 3 == 2) )
            if ( fSynthesis  )
            {
                Abc_NtkCleanData( pNtkNew );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
                Abc_NtkSynthesize( &pNtkNew, 1 );
            }
//            printf( "Var = %3d. Nodes = %6d. ", Abc_NtkPiNum(pNtkNew) - 1 - i, Abc_NtkNodeNum(pNtkNew) );
//            printf( "Var = %3d. Nodes = %6d. ", i - 2*nLatches, Abc_NtkNodeNum(pNtkNew) );
        }
//        printf( "\n" );
        Abc_NtkCleanData( pNtkNew );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
        {
            pObj = Abc_NtkPi( pNtkNew, i );
            assert( Abc_ObjFanoutNum(pObj) == 0 );
            Abc_NtkDeleteObj( pObj );
        }
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTransRel: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}